

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint16_t mipsdsp_satu16_sub_u16_u16(uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  undefined4 local_20;
  uint32_t temp;
  uint8_t temp16;
  CPUMIPSState_conflict5 *env_local;
  uint16_t b_local;
  uint16_t a_local;
  
  local_20 = (uint)a - (uint)b;
  if (((byte)((uint)local_20 >> 0x10) & 1) == 1) {
    local_20 = 0;
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return (uint16_t)local_20;
}

Assistant:

static inline uint16_t mipsdsp_satu16_sub_u16_u16(uint16_t a, uint16_t b,
                                                  CPUMIPSState *env)
{
    uint8_t  temp16;
    uint32_t temp;

    temp   = (uint32_t)a - (uint32_t)b;
    temp16 = (temp >> 16) & 0x01;

    if (temp16 == 1) {
        temp = 0x0000;
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp & 0x0000FFFF;
}